

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::TreeEnsembleClassifier::ByteSizeLong(TreeEnsembleClassifier *this)

{
  bool bVar1;
  TreeEnsemblePostEvaluationTransform TVar2;
  ClassLabelsCase CVar3;
  int iVar4;
  size_t sVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  TreeEnsembleClassifier *this_local;
  
  sStack_18 = 0;
  bVar1 = has_treeensemble(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleParameters>
                          (this->treeensemble_);
    sStack_18 = sStack_18 + 1;
  }
  TVar2 = postevaluationtransform(this);
  if (TVar2 != NoTransform) {
    TVar2 = postevaluationtransform(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(TVar2);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  CVar3 = ClassLabels_case(this);
  if (CVar3 != CLASSLABELS_NOT_SET) {
    if (CVar3 == kStringClassLabels) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::StringVector>
                        ((this->ClassLabels_).stringclasslabels_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
    else if (CVar3 == kInt64ClassLabels) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                        ((this->ClassLabels_).int64classlabels_);
      sStack_18 = sVar5 + 2 + sStack_18;
    }
  }
  iVar4 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar4;
  return sStack_18;
}

Assistant:

size_t TreeEnsembleClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleClassifier)
  size_t total_size = 0;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->has_treeensemble()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->treeensemble_);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}